

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pffft.c
# Opt level: O2

void pffft_real_preprocess(int Ncvec,v4sf *in,v4sf *out,v4sf *e)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  v4sf *pafVar19;
  long lVar20;
  long lVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  v4sf_union Xi;
  v4sf_union Xr;
  
  if (in != out) {
    for (lVar20 = 0; lVar20 != 0x10; lVar20 = lVar20 + 4) {
      *(float *)((long)&Xr + lVar20) = (*in)[lVar20 * 2];
      *(float *)((long)&Xi + lVar20) = in[1][lVar20 * 2];
    }
    fVar50 = (*in)[1] + in[6][1];
    fVar54 = (*in)[2] + in[6][2];
    fVar58 = (*in)[3] + in[6][3];
    fVar31 = (*in)[1] - in[6][1];
    fVar32 = (*in)[2] - in[6][2];
    fVar33 = (*in)[3] - in[6][3];
    fVar64 = in[2][1] + in[4][1];
    fVar68 = in[2][2] + in[4][2];
    fVar72 = in[2][3] + in[4][3];
    fVar34 = in[2][1] - in[4][1];
    fVar35 = in[2][2] - in[4][2];
    fVar37 = in[2][3] - in[4][3];
    fVar28 = in[1][1] + in[7][1];
    fVar29 = in[1][2] + in[7][2];
    fVar30 = in[1][3] + in[7][3];
    fVar39 = in[1][1] - in[7][1];
    fVar41 = in[1][2] - in[7][2];
    fVar43 = in[1][3] - in[7][3];
    fVar45 = in[3][1] + in[5][1];
    fVar46 = in[3][2] + in[5][2];
    fVar47 = in[3][3] + in[5][3];
    fVar22 = in[3][1] - in[5][1];
    fVar24 = in[3][2] - in[5][2];
    fVar26 = in[3][3] - in[5][3];
    fVar51 = fVar50 - fVar64;
    fVar55 = fVar54 - fVar68;
    fVar59 = fVar58 - fVar72;
    fVar65 = fVar31 - fVar45;
    fVar69 = fVar32 - fVar46;
    fVar73 = fVar33 - fVar47;
    fVar45 = fVar45 + fVar31;
    fVar46 = fVar46 + fVar32;
    fVar47 = fVar47 + fVar33;
    fVar23 = fVar22 + fVar39;
    fVar25 = fVar24 + fVar41;
    fVar27 = fVar26 + fVar43;
    fVar40 = fVar28 - fVar34;
    fVar42 = fVar29 - fVar35;
    fVar44 = fVar30 - fVar37;
    fVar28 = fVar28 + fVar34;
    fVar29 = fVar29 + fVar35;
    fVar30 = fVar30 + fVar37;
    fVar31 = (*e)[1];
    fVar32 = (*e)[2];
    fVar33 = (*e)[3];
    fVar34 = e[1][1];
    fVar35 = e[1][2];
    fVar37 = e[1][3];
    fVar36 = e[2][1];
    fVar38 = e[2][2];
    fVar9 = e[2][3];
    fVar10 = e[3][1];
    fVar11 = e[3][2];
    fVar12 = e[3][3];
    fVar13 = e[5][1];
    fVar14 = e[5][2];
    fVar15 = e[5][3];
    fVar16 = e[4][1];
    fVar17 = e[4][2];
    fVar18 = e[4][3];
    out[1][0] = fVar64 + fVar50;
    out[1][1] = fVar34 * fVar40 + fVar65 * fVar31;
    out[1][2] = fVar10 * fVar23 + fVar51 * fVar36;
    out[1][3] = fVar13 * fVar28 + fVar45 * fVar16;
    out[2][0] = fVar39 - fVar22;
    out[2][1] = fVar40 * fVar31 - fVar65 * fVar34;
    out[2][2] = fVar23 * fVar36 - fVar51 * fVar10;
    out[2][3] = fVar28 * fVar16 - fVar45 * fVar13;
    out[3][0] = fVar68 + fVar54;
    out[3][1] = fVar35 * fVar42 + fVar69 * fVar32;
    out[3][2] = fVar11 * fVar25 + fVar55 * fVar38;
    out[3][3] = fVar14 * fVar29 + fVar46 * fVar17;
    out[4][0] = fVar41 - fVar24;
    out[4][1] = fVar42 * fVar32 - fVar69 * fVar35;
    out[4][2] = fVar25 * fVar38 - fVar55 * fVar11;
    out[4][3] = fVar29 * fVar17 - fVar46 * fVar14;
    out[5][0] = fVar72 + fVar58;
    out[5][1] = fVar37 * fVar44 + fVar73 * fVar33;
    out[5][2] = fVar12 * fVar27 + fVar59 * fVar9;
    out[5][3] = fVar15 * fVar30 + fVar47 * fVar18;
    out[6][0] = fVar43 - fVar26;
    out[6][1] = fVar44 * fVar33 - fVar73 * fVar37;
    out[6][2] = fVar27 * fVar9 - fVar59 * fVar12;
    out[6][3] = fVar30 * fVar18 - fVar47 * fVar15;
    pafVar19 = e + 0xb;
    lVar21 = 0x80;
    for (lVar20 = 1; lVar20 < Ncvec / 4; lVar20 = lVar20 + 1) {
      pfVar1 = (float *)((long)*in + lVar21);
      pfVar2 = (float *)((long)in[1] + lVar21);
      pfVar3 = (float *)((long)in[2] + lVar21);
      pfVar4 = (float *)((long)in[3] + lVar21);
      pfVar5 = (float *)((long)in[4] + lVar21);
      pfVar6 = (float *)((long)in[5] + lVar21);
      pfVar7 = (float *)((long)in[6] + lVar21);
      pfVar8 = (float *)((long)in[7] + lVar21);
      fVar48 = *pfVar1 + *pfVar7;
      fVar52 = pfVar1[1] + pfVar7[1];
      fVar56 = pfVar1[2] + pfVar7[2];
      fVar60 = pfVar1[3] + pfVar7[3];
      fVar31 = *pfVar1 - *pfVar7;
      fVar32 = pfVar1[1] - pfVar7[1];
      fVar33 = pfVar1[2] - pfVar7[2];
      fVar34 = pfVar1[3] - pfVar7[3];
      fVar62 = *pfVar3 + *pfVar5;
      fVar66 = pfVar3[1] + pfVar5[1];
      fVar70 = pfVar3[2] + pfVar5[2];
      fVar74 = pfVar3[3] + pfVar5[3];
      fVar35 = *pfVar3 - *pfVar5;
      fVar37 = pfVar3[1] - pfVar5[1];
      fVar36 = pfVar3[2] - pfVar5[2];
      fVar38 = pfVar3[3] - pfVar5[3];
      fVar44 = *pfVar2 + *pfVar8;
      fVar45 = pfVar2[1] + pfVar8[1];
      fVar46 = pfVar2[2] + pfVar8[2];
      fVar47 = pfVar2[3] + pfVar8[3];
      fVar50 = *pfVar2 - *pfVar8;
      fVar54 = pfVar2[1] - pfVar8[1];
      fVar58 = pfVar2[2] - pfVar8[2];
      fVar64 = pfVar2[3] - pfVar8[3];
      fVar68 = *pfVar4 + *pfVar6;
      fVar69 = pfVar4[1] + pfVar6[1];
      fVar72 = pfVar4[2] + pfVar6[2];
      fVar73 = pfVar4[3] + pfVar6[3];
      fVar28 = *pfVar4 - *pfVar6;
      fVar30 = pfVar4[1] - pfVar6[1];
      fVar40 = pfVar4[2] - pfVar6[2];
      fVar42 = pfVar4[3] - pfVar6[3];
      fVar49 = fVar48 - fVar62;
      fVar53 = fVar52 - fVar66;
      fVar57 = fVar56 - fVar70;
      fVar61 = fVar60 - fVar74;
      fVar63 = fVar31 - fVar68;
      fVar67 = fVar32 - fVar69;
      fVar71 = fVar33 - fVar72;
      fVar75 = fVar34 - fVar73;
      fVar68 = fVar68 + fVar31;
      fVar69 = fVar69 + fVar32;
      fVar72 = fVar72 + fVar33;
      fVar73 = fVar73 + fVar34;
      fVar29 = fVar28 + fVar50;
      fVar39 = fVar30 + fVar54;
      fVar41 = fVar40 + fVar58;
      fVar43 = fVar42 + fVar64;
      fVar51 = fVar44 - fVar35;
      fVar55 = fVar45 - fVar37;
      fVar59 = fVar46 - fVar36;
      fVar65 = fVar47 - fVar38;
      fVar44 = fVar44 + fVar35;
      fVar45 = fVar45 + fVar37;
      fVar46 = fVar46 + fVar36;
      fVar47 = fVar47 + fVar38;
      fVar31 = pafVar19[-5][0];
      fVar32 = pafVar19[-5][1];
      fVar33 = pafVar19[-5][2];
      fVar34 = pafVar19[-5][3];
      fVar35 = pafVar19[-4][0];
      fVar37 = pafVar19[-4][1];
      fVar36 = pafVar19[-4][2];
      fVar38 = pafVar19[-4][3];
      fVar9 = pafVar19[-3][0];
      fVar10 = pafVar19[-3][1];
      fVar11 = pafVar19[-3][2];
      fVar12 = pafVar19[-3][3];
      fVar13 = pafVar19[-2][0];
      fVar14 = pafVar19[-2][1];
      fVar15 = pafVar19[-2][2];
      fVar16 = pafVar19[-2][3];
      fVar17 = (*pafVar19)[0];
      fVar18 = (*pafVar19)[1];
      fVar22 = (*pafVar19)[2];
      fVar23 = (*pafVar19)[3];
      fVar24 = pafVar19[-1][0];
      fVar25 = pafVar19[-1][1];
      fVar26 = pafVar19[-1][2];
      fVar27 = pafVar19[-1][3];
      pfVar1 = (float *)((long)out[-1] + lVar21);
      *pfVar1 = fVar62 + fVar48;
      pfVar1[1] = fVar35 * fVar51 + fVar63 * fVar31;
      pfVar1[2] = fVar13 * fVar29 + fVar49 * fVar9;
      pfVar1[3] = fVar17 * fVar44 + fVar68 * fVar24;
      pfVar1 = (float *)((long)*out + lVar21);
      *pfVar1 = fVar50 - fVar28;
      pfVar1[1] = fVar51 * fVar31 - fVar63 * fVar35;
      pfVar1[2] = fVar29 * fVar9 - fVar49 * fVar13;
      pfVar1[3] = fVar44 * fVar24 - fVar68 * fVar17;
      pfVar1 = (float *)((long)out[1] + lVar21);
      *pfVar1 = fVar66 + fVar52;
      pfVar1[1] = fVar37 * fVar55 + fVar67 * fVar32;
      pfVar1[2] = fVar14 * fVar39 + fVar53 * fVar10;
      pfVar1[3] = fVar18 * fVar45 + fVar69 * fVar25;
      pfVar1 = (float *)((long)out[2] + lVar21);
      *pfVar1 = fVar54 - fVar30;
      pfVar1[1] = fVar55 * fVar32 - fVar67 * fVar37;
      pfVar1[2] = fVar39 * fVar10 - fVar53 * fVar14;
      pfVar1[3] = fVar45 * fVar25 - fVar69 * fVar18;
      pfVar1 = (float *)((long)out[3] + lVar21);
      *pfVar1 = fVar70 + fVar56;
      pfVar1[1] = fVar36 * fVar59 + fVar71 * fVar33;
      pfVar1[2] = fVar15 * fVar41 + fVar57 * fVar11;
      pfVar1[3] = fVar22 * fVar46 + fVar72 * fVar26;
      pfVar1 = (float *)((long)out[4] + lVar21);
      *pfVar1 = fVar58 - fVar40;
      pfVar1[1] = fVar59 * fVar33 - fVar71 * fVar36;
      pfVar1[2] = fVar41 * fVar11 - fVar57 * fVar15;
      pfVar1[3] = fVar46 * fVar26 - fVar72 * fVar22;
      pfVar1 = (float *)((long)out[5] + lVar21);
      *pfVar1 = fVar74 + fVar60;
      pfVar1[1] = fVar38 * fVar65 + fVar75 * fVar34;
      pfVar1[2] = fVar16 * fVar43 + fVar61 * fVar12;
      pfVar1[3] = fVar23 * fVar47 + fVar73 * fVar27;
      pfVar1 = (float *)((long)out[6] + lVar21);
      *pfVar1 = fVar64 - fVar42;
      pfVar1[1] = fVar65 * fVar34 - fVar75 * fVar38;
      pfVar1[2] = fVar43 * fVar12 - fVar61 * fVar16;
      pfVar1[3] = fVar47 * fVar27 - fVar73 * fVar23;
      pafVar19 = pafVar19 + 6;
      lVar21 = lVar21 + 0x80;
    }
    (*out)[0] = Xr.v[2] * 2.0 + Xr.v[0] + Xi.v[0];
    (*out)[1] = Xi.v[2] * -2.0 + (Xr.v[0] - Xi.v[0]);
    (*out)[2] = Xr.v[2] * -2.0 + Xr.v[0] + Xi.v[0];
    (*out)[3] = Xi.v[2] * 2.0 + (Xr.v[0] - Xi.v[0]);
    lVar20 = (long)(Ncvec * 2);
    out[lVar20 + -1][0] = Xr.v[1] + Xr.v[3] + Xr.v[1] + Xr.v[3];
    fVar31 = (Xi.v[1] + Xi.v[3]) * -1.4142135;
    out[lVar20 + -1][1] = (Xr.v[1] - Xr.v[3]) * 1.4142135 + fVar31;
    out[lVar20 + -1][2] = (Xi.v[3] - Xi.v[1]) + (Xi.v[3] - Xi.v[1]);
    out[lVar20 + -1][3] = (Xr.v[1] - Xr.v[3]) * -1.4142135 + fVar31;
    return;
  }
  __assert_fail("in != out",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jcj83429[P]ShapingClipper/pffft.c"
                ,0x626,"void pffft_real_preprocess(int, const v4sf *, v4sf *, const v4sf *)");
}

Assistant:

static NEVER_INLINE(void) pffft_real_preprocess(int Ncvec, const v4sf *in, v4sf *out, const v4sf *e) {
  int k, dk = Ncvec/SIMD_SZ; // number of 4x4 matrix blocks
  /* fftpack order is f0r f1r f1i f2r f2i ... f(n-1)r f(n-1)i f(n)r */

  v4sf_union Xr, Xi, *uout = (v4sf_union*)out;
  float cr0, ci0, cr1, ci1, cr2, ci2, cr3, ci3;
  static const float s = M_SQRT2;
  assert(in != out);
  for (k=0; k < 4; ++k) {
    Xr.f[k] = ((float*)in)[8*k];
    Xi.f[k] = ((float*)in)[8*k+4];
  }

  pffft_real_preprocess_4x4(in, e, out+1, 1); // will write only 6 values

  /*
    [Xr0 Xr1 Xr2 Xr3 Xi0 Xi1 Xi2 Xi3]

    [cr0] [1   0   2   0   1   0   0   0]
    [cr1] [1   0   0   0  -1   0  -2   0]
    [cr2] [1   0  -2   0   1   0   0   0]
    [cr3] [1   0   0   0  -1   0   2   0]
    [ci0] [0   2   0   2   0   0   0   0]
    [ci1] [0   s   0  -s   0  -s   0  -s]
    [ci2] [0   0   0   0   0  -2   0   2]
    [ci3] [0  -s   0   s   0  -s   0  -s]
  */
  for (k=1; k < dk; ++k) {    
    pffft_real_preprocess_4x4(in+8*k, e + k*6, out-1+k*8, 0);
  }

  cr0=(Xr.f[0]+Xi.f[0]) + 2*Xr.f[2]; uout[0].f[0] = cr0;
  cr1=(Xr.f[0]-Xi.f[0]) - 2*Xi.f[2]; uout[0].f[1] = cr1;
  cr2=(Xr.f[0]+Xi.f[0]) - 2*Xr.f[2]; uout[0].f[2] = cr2;
  cr3=(Xr.f[0]-Xi.f[0]) + 2*Xi.f[2]; uout[0].f[3] = cr3;
  ci0= 2*(Xr.f[1]+Xr.f[3]);                       uout[2*Ncvec-1].f[0] = ci0;
  ci1= s*(Xr.f[1]-Xr.f[3]) - s*(Xi.f[1]+Xi.f[3]); uout[2*Ncvec-1].f[1] = ci1;
  ci2= 2*(Xi.f[3]-Xi.f[1]);                       uout[2*Ncvec-1].f[2] = ci2;
  ci3=-s*(Xr.f[1]-Xr.f[3]) - s*(Xi.f[1]+Xi.f[3]); uout[2*Ncvec-1].f[3] = ci3;
}